

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_72e95::testVectorFilter(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  ErrorCode EVar2;
  ostream *poVar3;
  Value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  iterator local_270;
  size_type local_268;
  undefined1 local_25a;
  allocator<char> local_259 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  iterator local_230;
  size_type local_228;
  Value local_220;
  undefined1 local_1f2;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  iterator local_1c8;
  size_type local_1c0;
  Value local_1b8;
  undefined4 local_190;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18c;
  undefined1 local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  Value local_98;
  Value local_60;
  undefined1 local_38 [8];
  Value v;
  
  Json::Value::Value((Value *)local_38,arrayValue);
  Json::Value::Value(&local_60,"Hello");
  Json::Value::append((Value *)local_38,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::Value(&local_98,"world!");
  Json::Value::append((Value *)local_38,&local_98);
  Json::Value::~Value(&local_98);
  Json::Value::Value((Value *)&l.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ignore");
  Json::Value::append((Value *)local_38,
                      (Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"default",
             (allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_e8 = &local_108;
  local_e0 = 1;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&expected.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_03._M_len = local_e0;
  __l_03._M_array = local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,__l_03,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&expected.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8;
  do {
    local_2c0 = local_2c0 + -1;
    std::__cxx11::string::~string((string *)local_2c0);
  } while (local_2c0 != &local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_18b = 1;
  local_188 = &local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Hello",&local_189);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"world!",&local_18a);
  local_18b = 0;
  local_140 = &local_180;
  local_138 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_18c);
  __l_02._M_len = local_138;
  __l_02._M_array = local_140;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130,__l_02,&local_18c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_18c);
  local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140;
  do {
    local_300 = local_300 + -1;
    std::__cxx11::string::~string((string *)local_300);
  } while (local_300 != &local_180);
  std::allocator<char>::~allocator(&local_18a);
  std::allocator<char>::~allocator(&local_189);
  EVar2 = std::
          function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
          ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                        *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d8,(Value *)local_38);
  if (EVar2 == Success) {
    bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_130);
    if (bVar1) {
      Json::Value::Value(&local_1b8,2);
      this_00 = Json::Value::operator[]((Value *)local_38,1);
      Json::Value::operator=(this_00,&local_1b8);
      Json::Value::~Value(&local_1b8);
      local_1f2 = 1;
      local_1f0 = &local_1e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"default",&local_1f1);
      local_1f2 = 0;
      local_1c8 = &local_1e8;
      local_1c0 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_1c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8,__l_01);
      local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
      do {
        local_3b8 = local_3b8 + -1;
        std::__cxx11::string::~string((string *)local_3b8);
      } while (local_3b8 != &local_1e8);
      std::allocator<char>::~allocator(&local_1f1);
      EVar2 = std::
              function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
              ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d8,(Value *)local_38);
      if (EVar2 == InvalidString) {
        Json::Value::Value(&local_220,"Hello");
        Json::Value::operator=((Value *)local_38,&local_220);
        Json::Value::~Value(&local_220);
        local_25a = '\x01';
        local_259._1_8_ = &local_250;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"default",local_259)
        ;
        local_25a = '\0';
        local_230 = &local_250;
        local_228 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_230;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8,__l_00);
        local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230;
        do {
          local_428 = local_428 + -1;
          std::__cxx11::string::~string((string *)local_428);
        } while (local_428 != &local_250);
        std::allocator<char>::~allocator(local_259);
        EVar2 = std::
                function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                              *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,(Value *)local_38);
        if (EVar2 == InvalidArray) {
          local_298 = &local_290;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_290,"default",&local_299);
          local_270 = &local_290;
          local_268 = 1;
          __l._M_len = 1;
          __l._M_array = local_270;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,__l);
          local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_270;
          do {
            local_490 = local_490 + -1;
            std::__cxx11::string::~string((string *)local_490);
          } while (local_490 != &local_290);
          std::allocator<char>::~allocator(&local_299);
          EVar2 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_d8,(Value *)0x0);
          if (EVar2 == Success) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8);
            if (bVar1) {
              v.limit_._7_1_ = 1;
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(l.empty()) failed on line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16c);
              std::operator<<(poVar3,"\n");
              v.limit_._7_1_ = 0;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr) == ErrorCode::Success) failed on line "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16b);
            std::operator<<(poVar3,"\n");
            v.limit_._7_1_ = 0;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                                  );
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x168);
          std::operator<<(poVar3,"\n");
          v.limit_._7_1_ = 0;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x164);
        std::operator<<(poVar3,"\n");
        v.limit_._7_1_ = 0;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x160);
      std::operator<<(poVar3,"\n");
      v.limit_._7_1_ = 0;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::Success) failed on line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15f);
    std::operator<<(poVar3,"\n");
    v.limit_._7_1_ = 0;
  }
  local_190 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  Json::Value::~Value((Value *)local_38);
  return (bool)(v.limit_._7_1_ & 1);
}

Assistant:

bool testVectorFilter()
{
  Json::Value v(Json::arrayValue);
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{
    "Hello",
    "world!",
  };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::Success);
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidString);

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidArray);

  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(l.empty());

  return true;
}